

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O0

string * __thiscall
t_xsd_generator::xsd(string *__return_storage_ptr__,t_xsd_generator *this,string *in)

{
  allocator local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *in_local;
  t_xsd_generator *this_local;
  
  local_20 = in;
  in_local = (string *)this;
  this_local = (t_xsd_generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"xsd",&local_61);
  ns(__return_storage_ptr__,this,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string xsd(std::string in) { return ns(in, "xsd"); }